

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  bool bVar2;
  Ch CVar3;
  bool bVar4;
  bool bVar5;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int p;
  char *decimal;
  size_t length;
  bool cont;
  int maxExp;
  bool expMinus;
  int exp;
  size_t decimalPosition;
  int expFrac;
  bool useDouble;
  int significandDigit;
  bool use64bit;
  uint64_t i64;
  uint i;
  bool minus;
  bool useNanOrInf;
  double d;
  size_t startOffset;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> s;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  ParseErrorCode in_stack_fffffffffffffbfc;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffc00;
  uint i_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffc08;
  bool local_2c5;
  int local_2bc;
  int local_2ac;
  int local_2a0;
  ulong local_298;
  uint local_290;
  double local_288;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> local_268;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> local_260;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_248;
  char local_229;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_228;
  undefined1 local_21a;
  char local_219;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_218;
  undefined1 local_20a;
  char local_209;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_208;
  undefined1 local_1fa;
  char local_1f9;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1f8;
  undefined1 local_1ea;
  char local_1e9;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1e8;
  undefined1 local_1da;
  char local_1d9;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1d8;
  undefined1 local_1c9;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1c8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1c0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1b8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1b0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1a8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_1a0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_198;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_190;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_188;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_180;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_178;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_170;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_168;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_160;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_158;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_150;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_148;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_140;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_138;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_130;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_128;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_120;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_118;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_110;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_108;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_100;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_f8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_f0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_e8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_e0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_d8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_d0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_c8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_c0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_b8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_b0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_a8;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_a0;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_98;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_90;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_88;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_80;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_78;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_70;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_68;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_60;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_58;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_50;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_48;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_40;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_38;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_30;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_28;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_20;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_18;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_10;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *local_8;
  
  local_248 = in_RDX;
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy(&local_260,in_RSI);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::NumberStream
            (&local_268,in_RDI,&local_260.s);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Tell
            ((NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *)
             0x110778);
  local_288 = 0.0;
  local_1d8 = &local_268;
  local_1d9 = '-';
  local_1c8 = local_1d8;
  CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
  bVar6 = CVar3 == local_1d9;
  if (bVar6) {
    local_50 = local_1d8;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_1d8->is);
  }
  local_290 = 0;
  local_298 = 0;
  bVar2 = false;
  local_2a0 = 0;
  local_a8 = &local_268;
  local_1c9 = bVar6;
  CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
  if (CVar3 == '0') {
    local_290 = 0;
    local_58 = &local_268;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
  }
  else {
    local_b0 = &local_268;
    CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
    bVar4 = false;
    if ('0' < CVar3) {
      local_b8 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar4 = CVar3 < ':';
    }
    if (bVar4) {
      local_60 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
      local_290 = (int)CVar3 - 0x30;
      if (!bVar6) {
        do {
          local_d8 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar4 = false;
          if ('/' < CVar3) {
            local_e0 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
            bVar4 = CVar3 < ':';
          }
          if (!bVar4) goto LAB_00110d92;
          if (0x19999998 < local_290) {
            bVar4 = true;
            if (local_290 == 0x19999999) {
              local_e8 = &local_268;
              CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
              bVar4 = '5' < CVar3;
            }
            if (bVar4) goto LAB_00110c8e;
          }
          local_70 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
          local_290 = local_290 * 10 + CVar3 + -0x30;
          local_2a0 = local_2a0 + 1;
        } while( true );
      }
      do {
        local_c0 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar4 = false;
        if ('/' < CVar3) {
          local_c8 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar4 = CVar3 < ':';
        }
        if (!bVar4) goto LAB_00110d92;
        if (0xccccccb < local_290) {
          bVar4 = true;
          if (local_290 == 0xccccccc) {
            local_d0 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
            bVar4 = '8' < CVar3;
          }
          if (bVar4) goto LAB_00110af2;
        }
        local_68 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
        local_290 = local_290 * 10 + CVar3 + -0x30;
        local_2a0 = local_2a0 + 1;
      } while( true );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Tell
              ((NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false> *
               )0x110d27);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x110d4b);
    bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x110d5c);
    if (bVar4) goto LAB_0011219c;
  }
LAB_00110d92:
  bVar4 = false;
  if (bVar2) {
    if (!bVar6) {
      do {
        local_108 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar5 = false;
        if ('/' < CVar3) {
          local_110 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar5 = CVar3 < ':';
        }
        if (!bVar5) goto LAB_00111161;
        if (0x1999999999999998 < local_298) {
          bVar5 = true;
          if (local_298 == 0x1999999999999999) {
            local_118 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
            bVar5 = '5' < CVar3;
          }
          if (bVar5) goto LAB_001110ad;
        }
        local_80 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
        local_298 = local_298 * 10 + (ulong)((int)CVar3 - 0x30);
        local_2a0 = local_2a0 + 1;
      } while( true );
    }
    do {
      local_f0 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar5 = false;
      if ('/' < CVar3) {
        local_f8 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar5 = CVar3 < ':';
      }
      if (!bVar5) break;
      if (0xccccccccccccccb < local_298) {
        bVar5 = true;
        if (local_298 == 0xccccccccccccccc) {
          local_100 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar5 = '8' < CVar3;
        }
        if (bVar5) goto LAB_00110ed7;
      }
      local_78 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
      local_298 = local_298 * 10 + (ulong)((int)CVar3 - 0x30);
      local_2a0 = local_2a0 + 1;
    } while( true );
  }
LAB_00111161:
  if (bVar4) {
    do {
      local_120 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar5 = false;
      if ('/' < CVar3) {
        local_128 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar5 = CVar3 < ':';
      }
      if (!bVar5) break;
      if (1.7976931348623158e+307 <= local_288) {
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x111242);
        bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x111253);
        if (bVar5) goto LAB_0011219c;
      }
      local_88 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
      local_288 = local_288 * 10.0 + (double)(CVar3 + -0x30);
    } while( true );
  }
  local_2ac = 0;
  local_1e8 = &local_268;
  local_1e9 = '.';
  local_1c0 = local_1e8;
  CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
  local_1da = CVar3 == local_1e9;
  if ((bool)local_1da) {
    local_48 = local_1e8;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_1e8->is);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Length
              (&local_268);
    local_130 = &local_268;
    CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
    bVar5 = false;
    if ('/' < CVar3) {
      local_138 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar5 = CVar3 < ':';
    }
    if (!bVar5) {
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Tell
                ((NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>
                  *)0x11146b);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x11148f);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x1114a0);
      if (bVar5) goto LAB_0011219c;
    }
    if (!bVar4) {
      if (!bVar2) {
        local_298 = (ulong)local_290;
      }
      while( true ) {
        local_140 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar4 = false;
        if ('/' < CVar3) {
          local_148 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar4 = CVar3 < ':';
        }
        if ((!bVar4) || (0x1fffffffffffff < local_298)) break;
        local_90 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
        local_298 = local_298 * 10 + (ulong)((int)CVar3 - 0x30);
        local_2ac = local_2ac + -1;
        if (local_298 != 0) {
          local_2a0 = local_2a0 + 1;
        }
      }
      auVar9._8_4_ = (int)(local_298 >> 0x20);
      auVar9._0_8_ = local_298;
      auVar9._12_4_ = 0x45300000;
      local_288 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_298) - 4503599627370496.0);
      bVar4 = true;
    }
    while( true ) {
      local_150 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar5 = false;
      if ('/' < CVar3) {
        local_158 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar5 = CVar3 < ':';
      }
      if (!bVar5) break;
      if (local_2a0 < 0x11) {
        local_98 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
        local_288 = local_288 * 10.0 + (double)(CVar3 + -0x30);
        local_2ac = local_2ac + -1;
        if (0.0 < local_288) {
          local_2a0 = local_2a0 + 1;
        }
      }
      else {
        local_a0 = &local_268;
        GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Length
              (&local_268);
  }
  local_1f8 = &local_268;
  local_1f9 = 'e';
  local_1b8 = local_1f8;
  CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
  local_1ea = CVar3 == local_1f9;
  if ((bool)local_1ea) {
    local_40 = local_1f8;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_1f8->is);
LAB_0011193f:
    if (!bVar4) {
      bVar4 = true;
    }
    local_218 = &local_268;
    local_219 = '+';
    local_1a8 = local_218;
    CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
    local_20a = CVar3 == local_219;
    if ((bool)local_20a) {
      local_30 = local_218;
      GenericStringStream<rapidjson::UTF8<char>_>::Take(local_218->is);
      bVar5 = false;
    }
    else {
      local_228 = &local_268;
      local_229 = '-';
      local_1a0 = local_228;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      local_21a = CVar3 == local_229;
      bVar5 = (bool)local_21a;
      if ((bool)local_21a) {
        local_28 = local_228;
        GenericStringStream<rapidjson::UTF8<char>_>::Take(local_228->is);
      }
    }
    local_160 = &local_268;
    CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
    bVar1 = false;
    if ('/' < CVar3) {
      local_168 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
      bVar1 = CVar3 < ':';
    }
    if (bVar1) {
      local_8 = &local_268;
      CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
      local_2bc = CVar3 + -0x30;
      if (!bVar5) {
        do {
          do {
            local_190 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
            bVar5 = false;
            if ('/' < CVar3) {
              local_198 = &local_268;
              CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
              bVar5 = CVar3 < ':';
            }
            if (!bVar5) goto LAB_00111f0e;
            local_20 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
            local_2bc = local_2bc * 10 + CVar3 + -0x30;
          } while (local_2bc <= 0x134 - local_2ac);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x111e3c);
          bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x111e4d);
        } while (!bVar5);
        goto LAB_0011219c;
      }
      while( true ) {
        local_170 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
        bVar5 = false;
        if ('/' < CVar3) {
          local_178 = &local_268;
          CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
          bVar5 = CVar3 < ':';
        }
        if (!bVar5) break;
        local_10 = &local_268;
        CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
        local_2bc = local_2bc * 10 + CVar3 + -0x30;
        if (0xccccccb < local_2bc) {
          while( true ) {
            local_180 = &local_268;
            CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
            bVar5 = false;
            if ('/' < CVar3) {
              local_188 = &local_268;
              CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
              bVar5 = CVar3 < ':';
            }
            if (!bVar5) break;
            local_18 = &local_268;
            GenericStringStream<rapidjson::UTF8<char>_>::Take(local_268.is);
          }
        }
      }
    }
    else {
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Tell
                ((NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>
                  *)0x111e95);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x111eb3);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x111ec4);
      if (bVar5) goto LAB_0011219c;
    }
  }
  else {
    local_208 = &local_268;
    local_209 = 'E';
    local_1b0 = local_208;
    CVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_268.is);
    local_1fa = CVar3 == local_209;
    if ((bool)local_1fa) {
      local_38 = local_208;
      GenericStringStream<rapidjson::UTF8<char>_>::Take(local_208->is);
      goto LAB_0011193f;
    }
  }
LAB_00111f0e:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Length
            (&local_268);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false,_false>::Pop
            (&local_268);
  if (bVar4) {
    in_stack_fffffffffffffc00 =
         (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
         internal::StrtodNormalPrecision
                   ((double)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
    if (bVar6) {
      in_stack_fffffffffffffc00 =
           (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
           ((ulong)in_stack_fffffffffffffc00 ^ 0x8000000000000000);
    }
    local_2c5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Double(local_248,(double)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffbfc = CONCAT13(local_2c5,(int3)in_stack_fffffffffffffbfc);
  }
  else if (bVar2) {
    if (bVar6) {
      local_2c5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(in_stack_fffffffffffffc08,(int64_t)in_stack_fffffffffffffc00);
      in_stack_fffffffffffffbfc =
           CONCAT22((short)(in_stack_fffffffffffffbfc >> 0x10),
                    CONCAT11(local_2c5,(char)in_stack_fffffffffffffbfc));
    }
    else {
      local_2c5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(in_stack_fffffffffffffc08,(uint64_t)in_stack_fffffffffffffc00);
      in_stack_fffffffffffffbfc = CONCAT31((int3)(in_stack_fffffffffffffbfc >> 8),local_2c5);
    }
  }
  else {
    i_00 = (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20);
    if (bVar6) {
      local_2c5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int(in_stack_fffffffffffffc08,i_00);
    }
    else {
      local_2c5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint(in_stack_fffffffffffffc08,i_00);
    }
  }
  if (((local_2c5 ^ 0xffU) & 1) != 0) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,0x112155);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x112166);
  }
LAB_0011219c:
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy(&local_260);
  return;
LAB_00110c8e:
  local_298 = (ulong)local_290;
  bVar2 = true;
  goto LAB_00110d92;
LAB_00110af2:
  local_298 = (ulong)local_290;
  bVar2 = true;
  goto LAB_00110d92;
LAB_001110ad:
  auVar8._8_4_ = (int)(local_298 >> 0x20);
  auVar8._0_8_ = local_298;
  auVar8._12_4_ = 0x45300000;
  local_288 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_298) - 4503599627370496.0);
  bVar4 = true;
  goto LAB_00111161;
LAB_00110ed7:
  auVar7._8_4_ = (int)(local_298 >> 0x20);
  auVar7._0_8_ = local_298;
  auVar7._12_4_ = 0x45300000;
  local_288 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_298) - 4503599627370496.0);
  bVar4 = true;
  goto LAB_00111161;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }